

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

ostream * plot::detail::operator<<(ostream *stream,value_type *line)

{
  string_view fill;
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  reference line_00;
  char *in_RCX;
  Label *pLVar5;
  Size SVar6;
  ansi_manip_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>
  aVar7;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  basic_string_view<char,_std::char_traits<char>_> __str_05;
  ansi_manip_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>
  local_1c8;
  basic_ostream<char,_std::char_traits<char>_> *local_1b8;
  char *local_1b0;
  ansi_manip_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>
  local_1a8 [3];
  int local_174;
  int i;
  ansi_manip_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>
  local_160 [2];
  char *local_140;
  ansi_manip_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>
  local_130;
  label_line local_120;
  undefined1 local_110 [8];
  value_type lbl_line;
  undefined1 local_e0 [8];
  Label lbl;
  Border border;
  Size size;
  value_type *line_local;
  ostream *stream_local;
  
  SVar6 = block_traits<plot::RealCanvas<plot::BrailleCanvas>_*>::size(line->frame_->block_);
  memcpy(&lbl.fill_._M_str,&line->frame_->border_,0x80);
  border.bottom_right._M_str = (char *)SVar6.x;
  if (line->overflow_ < 0) {
    fill._M_str = (char *)border.top._M_len;
    fill._M_len = (size_t)border.top_left._M_str;
    label((Label *)local_e0,line->frame_->label_,line->frame_->align_,
          (size_t)border.bottom_right._M_str,fill);
    local_120 = (label_line)Label::cbegin((Label *)local_e0);
    pvVar2 = block_iterator<plot::Label,_plot::detail::label_line>::operator*
                       ((block_iterator<plot::Label,_plot::detail::label_line> *)&local_120);
    pLVar5 = pvVar2->label_;
    lbl_line.label_ = (Label *)pvVar2->overflow_;
    local_110 = (undefined1  [8])pLVar5;
    aVar7 = TerminalInfo::reset(&line->frame_->term_);
    local_130.manip = aVar7.manip;
    local_130.mode = aVar7.mode;
    poVar3 = operator<<(stream,&local_130);
    local_140 = lbl.fill_._M_str;
    __str._M_str = (char *)pLVar5;
    __str._M_len = border.top_left._M_len;
    pbVar4 = std::experimental::fundamentals_v1::operator<<
                       ((fundamentals_v1 *)poVar3,
                        (basic_ostream<char,_std::char_traits<char>_> *)lbl.fill_._M_str,__str);
    poVar3 = operator<<(pbVar4,(label_line *)local_110);
    __str_00._M_str = (char *)pLVar5;
    __str_00._M_len = border.top_right._M_len;
    stream_local = std::experimental::fundamentals_v1::operator<<
                             ((fundamentals_v1 *)poVar3,
                              (basic_ostream<char,_std::char_traits<char>_> *)border.top._M_str,
                              __str_00);
  }
  else {
    bVar1 = block_iterator<plot::BrailleCanvas,_plot::detail::braille::line_t>::operator==
                      (&line->line_,&line->end_);
    if (bVar1) {
      aVar7 = TerminalInfo::reset(&line->frame_->term_);
      local_160[0].manip = aVar7.manip;
      local_160[0].mode = aVar7.mode;
      poVar3 = operator<<(stream,local_160);
      __str_01._M_str = in_RCX;
      __str_01._M_len = border.bottom_left._M_len;
      std::experimental::fundamentals_v1::operator<<
                ((fundamentals_v1 *)poVar3,
                 (basic_ostream<char,_std::char_traits<char>_> *)border.right._M_str,__str_01);
      for (local_174 = 0; (long)local_174 < (long)border.bottom_right._M_str;
          local_174 = local_174 + 1) {
        __str_02._M_str = in_RCX;
        __str_02._M_len = border.bottom._M_len;
        std::experimental::fundamentals_v1::operator<<
                  ((fundamentals_v1 *)stream,
                   (basic_ostream<char,_std::char_traits<char>_> *)border.bottom_left._M_str,
                   __str_02);
      }
      __str_03._M_str = in_RCX;
      __str_03._M_len = border.bottom_right._M_len;
      stream_local = std::experimental::fundamentals_v1::operator<<
                               ((fundamentals_v1 *)stream,
                                (basic_ostream<char,_std::char_traits<char>_> *)border.bottom._M_str
                                ,__str_03);
    }
    else {
      aVar7 = TerminalInfo::reset(&line->frame_->term_);
      local_1a8[0].manip = aVar7.manip;
      local_1a8[0].mode = aVar7.mode;
      poVar3 = operator<<(stream,local_1a8);
      local_1b8 = (basic_ostream<char,_std::char_traits<char>_> *)
                  (line->frame_->border_).left._M_len;
      local_1b0 = (line->frame_->border_).left._M_str;
      __str_04._M_str = (char *)local_1b8;
      __str_04._M_len = (size_t)local_1b0;
      pbVar4 = std::experimental::fundamentals_v1::operator<<
                         ((fundamentals_v1 *)poVar3,local_1b8,__str_04);
      line_00 = block_iterator<plot::BrailleCanvas,_plot::detail::braille::line_t>::operator*
                          (&line->line_);
      poVar3 = braille::operator<<(pbVar4,line_00);
      aVar7 = TerminalInfo::reset(&line->frame_->term_);
      local_1c8.manip = aVar7.manip;
      local_1c8.mode = aVar7.mode;
      poVar3 = operator<<(poVar3,&local_1c8);
      pbVar4 = (basic_ostream<char,_std::char_traits<char>_> *)(line->frame_->border_).right._M_len;
      __str_05._M_str = (char *)pbVar4;
      __str_05._M_len = (size_t)(line->frame_->border_).right._M_str;
      stream_local = std::experimental::fundamentals_v1::operator<<
                               ((fundamentals_v1 *)poVar3,pbVar4,__str_05);
    }
  }
  return stream_local;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, frame_line<Block> const& line) {
        auto size = detail::block_traits<Block>::size(line.frame_->block_);
        auto const border = line.frame_->border_;

        if (line.overflow_ < 0) {
            auto lbl = label(line.frame_->label_, line.frame_->align_, size.x, border.top);
            auto lbl_line = *lbl.cbegin();

            return stream << line.frame_->term_.reset()
                          << border.top_left << lbl_line << border.top_right;
        } else if (line.line_ == line.end_) {
            stream << line.frame_->term_.reset() << border.bottom_left;

            for (auto i = 0; i < size.x; ++i)
                stream << border.bottom;

            return stream << border.bottom_right;
        }

        return stream << line.frame_->term_.reset()
                      << line.frame_->border_.left
                      << *line.line_
                      << line.frame_->term_.reset()
                      << line.frame_->border_.right;
    }